

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import-utils.h
# Opt level: O0

Function * __thiscall wasm::ImportInfo::getImportedFunction(ImportInfo *this,Name module,Name base)

{
  Function *pFVar1;
  bool bVar2;
  reference ppFVar3;
  Function *import;
  iterator __end2;
  iterator __begin2;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *__range2;
  ImportInfo *this_local;
  Name base_local;
  Name module_local;
  
  base_local.super_IString.str._M_len = base.super_IString.str._M_str;
  this_local = base.super_IString.str._M_len;
  base_local.super_IString.str._M_str = module.super_IString.str._M_len;
  __end2 = std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::begin
                     (&this->importedFunctions);
  import = (Function *)
           std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::end
                     (&this->importedFunctions);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<wasm::Function_**,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                                *)&import);
    if (!bVar2) {
      return (Function *)0x0;
    }
    ppFVar3 = __gnu_cxx::
              __normal_iterator<wasm::Function_**,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
              ::operator*(&__end2);
    pFVar1 = *ppFVar3;
    bVar2 = IString::operator==(&(pFVar1->super_Importable).module.super_IString,
                                (IString *)&base_local.super_IString.str._M_str);
    if ((bVar2) &&
       (bVar2 = IString::operator==(&(pFVar1->super_Importable).base.super_IString,
                                    (IString *)&this_local), bVar2)) break;
    __gnu_cxx::
    __normal_iterator<wasm::Function_**,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
    ::operator++(&__end2);
  }
  return pFVar1;
}

Assistant:

Function* getImportedFunction(Name module, Name base) {
    for (auto* import : importedFunctions) {
      if (import->module == module && import->base == base) {
        return import;
      }
    }
    return nullptr;
  }